

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupTimes(Gia_Man_t *p,int nTimes)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Gia_Man_t *p_00;
  char *pcVar5;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Vec_Int_t *p_04;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  Vec_Int_t *p_05;
  int iVar8;
  
  if (nTimes < 1) {
    __assert_fail("nTimes > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                  ,0x484,"Gia_Man_t *Gia_ManDupTimes(Gia_Man_t *, int)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar5 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar5;
  pcVar5 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar5;
  p->pObjs->Value = 0;
  p_01 = Vec_IntAlloc((p->vCis->nSize - p->nRegs) * nTimes);
  p_02 = Vec_IntAlloc((p->vCos->nSize - p->nRegs) * nTimes);
  p_03 = Vec_IntAlloc(p->nRegs * nTimes);
  p_04 = Vec_IntAlloc(p->nRegs * nTimes);
  iVar4 = 0;
  do {
    if (iVar4 == nTimes) {
      p_00->vCis->nSize = 0;
      iVar4 = p_01->nSize;
      iVar8 = 0;
      if (iVar4 < 1) {
        iVar4 = 0;
        iVar8 = 0;
      }
      for (; iVar4 != iVar8; iVar8 = iVar8 + 1) {
        iVar1 = Vec_IntEntry(p_01,iVar8);
        pGVar6 = Gia_ManObj(p_00,iVar1);
        Gia_ObjSetCioId(pGVar6,p_00->vCis->nSize);
        Vec_IntPush(p_00->vCis,iVar1);
      }
      iVar4 = p_04->nSize;
      iVar8 = 0;
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      for (; iVar4 != iVar8; iVar8 = iVar8 + 1) {
        iVar1 = Vec_IntEntry(p_04,iVar8);
        pGVar6 = Gia_ManObj(p_00,iVar1);
        Gia_ObjSetCioId(pGVar6,p_00->vCis->nSize);
        Vec_IntPush(p_00->vCis,iVar1);
      }
      p_00->vCos->nSize = 0;
      iVar4 = p_02->nSize;
      iVar8 = 0;
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      for (; iVar4 != iVar8; iVar8 = iVar8 + 1) {
        iVar1 = Vec_IntEntry(p_02,iVar8);
        pGVar6 = Gia_ManObj(p_00,iVar1);
        Gia_ObjSetCioId(pGVar6,p_00->vCos->nSize);
        Vec_IntPush(p_00->vCos,iVar1);
      }
      iVar4 = p_03->nSize;
      iVar8 = 0;
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      for (; iVar4 != iVar8; iVar8 = iVar8 + 1) {
        iVar1 = Vec_IntEntry(p_03,iVar8);
        pGVar6 = Gia_ManObj(p_00,iVar1);
        Gia_ObjSetCioId(pGVar6,p_00->vCos->nSize);
        Vec_IntPush(p_00->vCos,iVar1);
      }
      Vec_IntFree(p_01);
      Vec_IntFree(p_02);
      Vec_IntFree(p_03);
      Vec_IntFree(p_04);
      Gia_ManSetRegNum(p_00,nTimes * p->nRegs);
      return p_00;
    }
    iVar8 = 1;
    while ((iVar8 < p->nObjs && (pGVar6 = Gia_ManObj(p,iVar8), pGVar6 != (Gia_Obj_t *)0x0))) {
      uVar3 = (uint)*(ulong *)pGVar6;
      uVar7 = *(ulong *)pGVar6 & 0x1fffffff;
      if (uVar7 == 0x1fffffff || (int)uVar3 < 0) {
        if ((~uVar3 & 0x9fffffff) == 0) {
          uVar3 = Gia_ManAppendCi(p_00);
          pGVar6->Value = uVar3;
          iVar2 = Gia_ObjIsPi(p,pGVar6);
          iVar1 = Abc_Lit2Var(pGVar6->Value);
          p_05 = p_04;
          if (iVar2 != 0) {
            p_05 = p_01;
          }
        }
        else {
          if (-1 < (int)uVar3 || (int)uVar7 == 0x1fffffff) goto LAB_00552d8f;
          iVar1 = Gia_ObjFanin0Copy(pGVar6);
          uVar3 = Gia_ManAppendCo(p_00,iVar1);
          pGVar6->Value = uVar3;
          if ((~*(uint *)pGVar6 & 0x1fffffff) != 0 && (int)*(uint *)pGVar6 < 0) {
            iVar1 = Gia_ObjCioId(pGVar6);
            uVar3 = pGVar6->Value;
            if (iVar1 < p->vCos->nSize - p->nRegs) {
              iVar1 = Abc_Lit2Var(uVar3);
              p_05 = p_02;
              goto LAB_00552d88;
            }
          }
          iVar1 = Abc_Lit2Var(uVar3);
          p_05 = p_03;
        }
LAB_00552d88:
        Vec_IntPush(p_05,iVar1);
      }
      else {
        iVar1 = Gia_ObjFanin0Copy(pGVar6);
        iVar2 = Gia_ObjFanin1Copy(pGVar6);
        uVar3 = Gia_ManAppendAnd(p_00,iVar1,iVar2);
        pGVar6->Value = uVar3;
      }
LAB_00552d8f:
      iVar8 = iVar8 + 1;
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManDupTimes( Gia_Man_t * p, int nTimes )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    Vec_Int_t * vPis, * vPos, * vRis, * vRos;
    int i, t, Entry;
    assert( nTimes > 0 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    vPis = Vec_IntAlloc( Gia_ManPiNum(p) * nTimes );
    vPos = Vec_IntAlloc( Gia_ManPoNum(p) * nTimes );
    vRis = Vec_IntAlloc( Gia_ManRegNum(p) * nTimes );
    vRos = Vec_IntAlloc( Gia_ManRegNum(p) * nTimes );
    for ( t = 0; t < nTimes; t++ )
    {
        Gia_ManForEachObj1( p, pObj, i )
        {
            if ( Gia_ObjIsAnd(pObj) )
                pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
            else if ( Gia_ObjIsCi(pObj) )
            {
                pObj->Value = Gia_ManAppendCi( pNew );
                if ( Gia_ObjIsPi(p, pObj) )
                    Vec_IntPush( vPis, Abc_Lit2Var(pObj->Value) );
                else
                    Vec_IntPush( vRos, Abc_Lit2Var(pObj->Value) );
            }
            else if ( Gia_ObjIsCo(pObj) )
            {
                pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
                if ( Gia_ObjIsPo(p, pObj) )
                    Vec_IntPush( vPos, Abc_Lit2Var(pObj->Value) );
                else
                    Vec_IntPush( vRis, Abc_Lit2Var(pObj->Value) );
            }
        }
    }
    Vec_IntClear( pNew->vCis );
    Vec_IntForEachEntry( vPis, Entry, i )
    {
        Gia_ObjSetCioId( Gia_ManObj(pNew, Entry), Vec_IntSize(pNew->vCis) );
        Vec_IntPush( pNew->vCis, Entry );
    }
    Vec_IntForEachEntry( vRos, Entry, i )
    {
        Gia_ObjSetCioId( Gia_ManObj(pNew, Entry), Vec_IntSize(pNew->vCis) );
        Vec_IntPush( pNew->vCis, Entry );
    }
    Vec_IntClear( pNew->vCos );
    Vec_IntForEachEntry( vPos, Entry, i )
    {
        Gia_ObjSetCioId( Gia_ManObj(pNew, Entry), Vec_IntSize(pNew->vCos) );
        Vec_IntPush( pNew->vCos, Entry );
    }
    Vec_IntForEachEntry( vRis, Entry, i )
    {
        Gia_ObjSetCioId( Gia_ManObj(pNew, Entry), Vec_IntSize(pNew->vCos) );
        Vec_IntPush( pNew->vCos, Entry );
    }
    Vec_IntFree( vPis );
    Vec_IntFree( vPos );
    Vec_IntFree( vRis );
    Vec_IntFree( vRos );
    Gia_ManSetRegNum( pNew, nTimes * Gia_ManRegNum(p) );
    return pNew;
}